

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Z80Implementation.hpp
# Opt level: O3

void __thiscall
CPU::Z80::ProcessorBase::set_interrupt_line(ProcessorBase *this,bool value,HalfCycles offset)

{
  uint8_t *puVar1;
  byte bVar2;
  
  if ((this->super_ProcessorStorage).irq_line_ != value) {
    (this->super_ProcessorStorage).irq_line_ = value;
    if ((value) && ((this->super_ProcessorStorage).iff1_ == true)) {
      puVar1 = &(this->super_ProcessorStorage).request_status_;
      *puVar1 = *puVar1 | 1;
      bVar2 = 1;
    }
    else {
      puVar1 = &(this->super_ProcessorStorage).request_status_;
      *puVar1 = *puVar1 & 0xfe;
      bVar2 = 0;
    }
    if ((long)offset.super_WrappedInt<HalfCycles>.length_ < -1) {
      (this->super_ProcessorStorage).last_request_status_ =
           bVar2 | (this->super_ProcessorStorage).last_request_status_ & 0xfe;
    }
  }
  return;
}

Assistant:

void ProcessorBase::set_interrupt_line(bool value, HalfCycles offset) {
	if(irq_line_ == value) return;

	// IRQ requests are level triggered and masked.
	irq_line_ = value;
	if(irq_line_ && iff1_) {
		request_status_ |= Interrupt::IRQ;
	} else {
		request_status_ &= ~Interrupt::IRQ;
	}

	// If this change happened at least one cycle ago then: (i) we're promised that this is a machine
	// cycle per the contract on supplying an offset; and (ii) that means it happened before the lines
	// were sampled. So adjust the most recent sample.
	if(offset <= HalfCycles(-2)) {
		last_request_status_ = (last_request_status_ & ~Interrupt::IRQ) | (request_status_ & Interrupt::IRQ);
	}
}